

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  Type *pTVar1;
  Result RVar2;
  Result RVar3;
  Label *in_RAX;
  TypeVector *pTVar4;
  TypeVector *__range1;
  Type *pTVar5;
  Enum EVar6;
  Label *local_38;
  Label *label;
  
  local_38 = in_RAX;
  RVar2 = PopAndCheck1Type(this,I32,"br_if");
  RVar3 = GetLabel(this,depth,&local_38);
  EVar6 = Error;
  if (RVar3.enum_ != Error) {
    pTVar4 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar4 = &local_38->param_types;
    }
    RVar3 = PopAndCheckSignature(this,pTVar4,"br_if");
    EVar6 = (Enum)(RVar3.enum_ == Error || RVar2.enum_ == Error);
    pTVar4 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar4 = &local_38->param_types;
    }
    pTVar1 = (pTVar4->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar5 = (pTVar4->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
      PushType(this,*pTVar5);
    }
  }
  return (Result)EVar6;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}